

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Value *pAVar4;
  Am_Method_Wrapper *pAVar5;
  ostream *poVar6;
  ostream *this;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object cmd;
  Am_Object local_30;
  Am_Object how_set_inter;
  Am_Object local_18;
  int local_c;
  
  local_c = 0;
  Am_Initialize();
  Am_Object::Create((char *)&local_18);
  uVar1 = Am_Object::Set((ushort)&local_18,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x2d);
  uVar1 = Am_Object::Set(uVar1,0x66,500);
  uVar1 = Am_Object::Set(uVar1,0x67,200);
  uVar1 = Am_Object::Set(uVar1,(char *)0x6c,0x10410f);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar2);
  Am_Object::operator=(&window,pAVar3);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Create((char *)&cmd);
  uVar1 = Am_Object::Set((ushort)&cmd,(char *)0xb9,0x104133);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,true,1);
  Am_Object::Am_Object(&local_30,pAVar3);
  Am_Object::~Am_Object(&cmd);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_30,0xc5);
  Am_Object::Am_Object(&local_40,pAVar4);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&change_setting);
  Am_Object::Set((ushort)&local_40,(Am_Method_Wrapper *)0xca,(ulong)pAVar5);
  Am_Object::Am_Object(&local_48,(Am_Object *)&local_30);
  Am_Object::Add_Part((Am_Object *)&window,SUB81(&local_48,0),1);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,(Am_Object *)&window);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&local_50,0),1);
  Am_Object::~Am_Object(&local_50);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Type \'1\' to change cursor to red/yellow happy face");
  std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Type \'2\' to change cursor to blue/green ds9 ship");
  std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Type \'3\' to change cursor to purple/orange borg ship");
  std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Type \'4\' to change cursor to yellow/black crosshair");
  std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Type \'5\' to change cursor to white/red romulan ship");
  std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Type \'6\' to restore cursor Am_No_Value");
  std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Type \'q\' to quit ");
  this = (ostream *)
         std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  Am_Main_Event_Loop();
  Am_Cleanup();
  local_c = 0;
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_30);
  return local_c;
}

Assistant:

int
main(void)
{

  Am_Initialize();

  window = Am_Window.Create("window")
               .Set(Am_LEFT, 20)
               .Set(Am_TOP, 45)
               .Set(Am_WIDTH, 500)
               .Set(Am_HEIGHT, 200)
               .Set(Am_TITLE, "Happy Cursor Window")
               .Set(Am_FILL_STYLE, Am_Amulet_Purple);

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);
  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  window.Add_Part(how_set_inter);

  Am_Screen.Add_Part(window);

  cout << "Type '1' to change cursor to red/yellow happy face" << endl;
  cout << "Type '2' to change cursor to blue/green ds9 ship" << endl;
  cout << "Type '3' to change cursor to purple/orange borg ship" << endl;
  cout << "Type '4' to change cursor to yellow/black crosshair" << endl;
  cout << "Type '5' to change cursor to white/red romulan ship" << endl;
  cout << "Type '6' to restore cursor Am_No_Value" << endl;
  cout << "Type 'q' to quit " << endl << flush;

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}